

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O2

void __thiscall
anurbs::PointOnCurveProjection<3L>::compute
          (PointOnCurveProjection<3L> *this,Vector *sample,double max_distance)

{
  Pointer<CurveBaseD>_conflict *pPVar1;
  double *pdVar2;
  double *src;
  pointer pdVar3;
  pointer pMVar4;
  ResScalar RVar5;
  RealScalar RVar6;
  double dVar7;
  ResScalar RVar8;
  double dVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  long lVar13;
  Matrix<double,_1,_3,_1,_1,_3> *src_00;
  long lVar14;
  Index i;
  double dVar15;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double dVar16;
  double dVar17;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  Vector point_at_t1;
  value_type point1;
  value_type t1;
  value_type t0;
  Vector v;
  _Head_base<0UL,_double,_false> local_120;
  Vector point_at_t0;
  double *local_78;
  Vector *local_70;
  Vector closest_point;
  Vector local_48;
  
  pPVar1 = &this->m_curve;
  std::__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2> *)&point_at_t0,
             &pPVar1->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>);
  dVar15 = (double)(**(code **)(*(long *)point_at_t0.
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                         .m_storage.m_data.array[0] + 0x18))();
  local_1f0 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  src = point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)src);
  local_1e8 = 0.0;
  if (max_distance <= 0.0) {
    local_1f8 = INFINITY;
    lVar13 = 0;
    for (lVar14 = 1;
        pdVar3 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        lVar14 < (long)(this->m_tessellation).first.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar3 >> 3; lVar14 = lVar14 + 1) {
      t0 = pdVar3[lVar14 + 0xffffffffffffffff];
      pMVar4 = (this->m_tessellation).second.
               super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[2] = *(double *)
                  ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data + lVar13 + 0x10);
      pdVar2 = (double *)
               ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                       m_storage.m_data + lVar13);
      point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[0] = *pdVar2;
      point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[1] = pdVar2[1];
      t1 = pdVar3[lVar14];
      point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
           = *(double *)
              ((long)&pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                      m_storage.m_data + lVar13 + 0x10);
      pdVar2 = (double *)
               ((long)&pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                       m_storage.m_data + lVar13);
      point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
           = *pdVar2;
      point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
           = pdVar2[1];
      project_to_line((ParameterPoint *)&point_at_t0,sample,&point_at_t1,&point1,&t0,&t1);
      local_78 = src;
      local_70 = sample;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&v,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)&local_78);
      dVar17 = v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
               [2] * v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
                     .array[2] +
               v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
               [1] * v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
                     .array[1] +
               v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
               [0] * v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
                     .array[0];
      if (dVar17 < local_1f8) {
        local_1e8 = point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[0];
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
                  (&closest_point,(Matrix<double,_1,_3,_1,_1,_3> *)src);
        local_1f8 = dVar17;
      }
      lVar13 = lVar13 + 0x18;
    }
  }
  else {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[1];
    PolylineMapper<3L>::map
              ((tuple<double,_long,_double,_long> *)&v,
               (this->mapper)._M_t.
               super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
               .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl,&local_48,
               max_distance);
    pdVar3 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1e8 = local_120._M_head_impl *
                pdVar3[(long)v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                             m_storage.m_data.array[2]] +
                v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array[1] *
                pdVar3[(long)v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                             m_storage.m_data.array[0]];
    Eigen::operator*((type *)&point_at_t1,&local_120._M_head_impl,
                     (StorageBaseType *)
                     ((this->m_tessellation).second.
                      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                     (long)v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                           m_data.array[2]));
    Eigen::operator*((type *)&point1,
                     v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
                     .array + 1,
                     (StorageBaseType *)
                     ((this->m_tessellation).second.
                      super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                     (long)v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                           m_data.array[0]));
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>>
              (&closest_point,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)&point_at_t0);
  }
  dVar17 = this->m_tolerance;
  dVar16 = local_1f0;
  if (dVar15 <= local_1f0) {
    dVar16 = dVar15;
  }
  dVar11 = local_1f0;
  if (local_1f0 <= dVar15) {
    dVar11 = dVar15;
  }
  lVar14 = 6;
  do {
    lVar14 = lVar14 + -1;
    if (lVar14 == 0) break;
    std::__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2> *)&point_at_t1,
               &pPVar1->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*(long *)point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                          m_storage.m_data.array[0] + 0x30))
              (local_1e8._0_4_,
               (_Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)&point_at_t0,
               point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[0],2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array + 1));
    point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
         point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
         array[0];
    point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
         (double)sample;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&point_at_t1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)&point1);
    dVar12 = point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar9 = point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[1];
    dVar7 = point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[0];
    RVar5 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
                  ((long)point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                         m_storage.m_data.array[0] + 0x18),
                  (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&point_at_t1);
    RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::norm
                      ((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
                       ((long)point_at_t0.
                              super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                              .m_data.array[0] + 0x18));
    dVar9 = SQRT(dVar12 * dVar12 + dVar9 * dVar9 + dVar7 * dVar7);
    dVar7 = RVar6 * dVar9;
    bVar10 = dVar17 <= dVar9 &&
             dVar17 * 5.0 <= (double)(-(ulong)(dVar7 != 0.0) & (ulong)ABS(RVar5 / dVar7));
    if (bVar10) {
      RVar5 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
                    ((long)point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                           m_storage.m_data.array[0] + 0x18),
                    (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&point_at_t1);
      RVar8 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
                    ((long)point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                           m_storage.m_data.array[0] + 0x30),
                    (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&point_at_t1);
      local_1e8 = local_1e8 -
                  RVar5 / (RVar8 + *(double *)
                                    ((long)point_at_t0.
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                           .m_storage.m_data.array[0] + 0x28) *
                                   *(double *)
                                    ((long)point_at_t0.
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                           .m_storage.m_data.array[0] + 0x28) +
                                   *(double *)
                                    ((long)point_at_t0.
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                           .m_storage.m_data.array[0] + 0x20) *
                                   *(double *)
                                    ((long)point_at_t0.
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                           .m_storage.m_data.array[0] + 0x20) +
                                   *(double *)
                                    ((long)point_at_t0.
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                           .m_storage.m_data.array[0] + 0x18) *
                                   *(double *)
                                    ((long)point_at_t0.
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                           .m_storage.m_data.array[0] + 0x18));
      dVar7 = dVar11;
      if (local_1e8 <= dVar11) {
        dVar7 = local_1e8;
      }
      local_1e8 = (double)(-(ulong)(local_1e8 < dVar16) & (ulong)dVar16 |
                          ~-(ulong)(local_1e8 < dVar16) & (ulong)dVar7);
    }
    std::
    _Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
    ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     *)&point_at_t0);
  } while (bVar10);
  std::__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2> *)&point_at_t1,
             &pPVar1->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                        m_storage.m_data.array[0] + 0x28))(local_1e8._0_4_,&point_at_t0);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=(&closest_point,&point_at_t0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
              m_data.array + 1));
  point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = (double)sample;
  point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
       = (double)&closest_point;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&point_at_t0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&point_at_t1);
  std::__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2> *)&point_at_t1,
             &pPVar1->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                        m_storage.m_data.array[0] + 0x28))(SUB84(dVar15,0),&point_at_t0);
  dVar17 = point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
           .array[2] *
           point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
           .array[2] +
           point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
           .array[1] *
           point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
           .array[1] +
           point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
           .array[0] *
           point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
           .array[0];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
              m_data.array + 1));
  point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       (double)sample;
  point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       (double)&point_at_t0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&point_at_t1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&point1);
  if (dVar17 <= point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[2] *
                point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[2] +
                point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[1] *
                point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[1] +
                point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[0] *
                point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[0]) {
    std::__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2> *)&point1,
               &pPVar1->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>);
    src_00 = &point_at_t1;
    (**(code **)(*(long *)point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                          m_storage.m_data.array[0] + 0x28))(in_XMM1_Da,src_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
                .array + 1));
    v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
         (double)sample;
    v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
         (double)src_00;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&point1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)&v);
    if (dVar17 <= point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array[2] *
                  point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array[2] +
                  point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array[1] *
                  point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array[1] +
                  point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array[0] *
                  point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array[0]) {
      local_1f0 = local_1e8;
      src_00 = &closest_point;
    }
    this->m_parameter = local_1f0;
  }
  else {
    this->m_parameter = dVar15;
    src_00 = &point_at_t0;
  }
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
            (&this->m_point,src_00);
  return;
}

Assistant:

void compute(const Vector& sample, const double max_distance = 0)
    {
        const auto domain = Curve()->domain();

        // closest point to polyline

        double closest_parameter = 0;
        Vector closest_point;

        double closest_sq_distance = Infinity;

        const auto& [ts, points] = m_tessellation;

        if (max_distance <= 0) {
            for (Index i = 1; i < length(ts); i++) {
                const auto t0 = ts[i - 1];
                const auto point0 = points[i - 1];
                const auto t1 = ts[i];
                const auto point1 = points[i];

                const auto [t, point] = project_to_line(sample, point0, point1, t0, t1);

                const Vector v = point - sample;

                const double sq_distance = squared_norm(v);

                if (sq_distance < closest_sq_distance) {
                    closest_sq_distance = sq_distance;
                    closest_parameter = t;
                    closest_point = point;
                }
            }
        } else {
            const auto [wa, idx_a, wb, idx_b] = mapper->map(sample, max_distance);

            closest_parameter = wa * ts[idx_a] + wb * ts[idx_b];
            closest_point = wa * points[idx_a] + wb * points[idx_b];
        }

        // newton-raphson

        const Index max_iter = 5;
        const double eps1 = tolerance();
        const double eps2 = tolerance() * 5;

        for (Index i = 0; i < max_iter; i++) {
            auto f = Curve()->derivatives_at(closest_parameter, 2);

            Vector dif = f[0] - sample;

            double c1v = norm(dif);

            double c2n = dot(f[1], dif);
            double c2d = norm(f[1]) * c1v;
            double c2v = c2d != 0 ? c2n / c2d : 0;

            bool c1 = c1v < eps1;
            bool c2 = std::abs(c2v) < eps2;

            if (c1 || c2) { // FIXME: check if 'or' is correct (NURBS Book P.231)
                break;
            }

            double delta = dot(f[1], dif) / (dot(f[2], dif) + squared_norm(f[1]));

            double nextParameter = closest_parameter - delta;

            // FIXME: out-of-domain check

            // FIXME: 3. condition: (nextParameter - closest_parameter) * f[1].norm();

            closest_parameter = domain.clamp(nextParameter);
        }

        closest_point = Curve()->point_at(closest_parameter);

        closest_sq_distance = squared_norm(Vector(sample - closest_point));

        Vector point_at_t0 = Curve()->point_at(domain.t0());

        if (squared_norm(Vector(sample - point_at_t0)) < closest_sq_distance) {
            m_parameter = domain.t0();
            m_point = point_at_t0;
            return;
        }

        Vector point_at_t1 = Curve()->point_at(domain.t1());

        if (squared_norm(Vector(sample - point_at_t1)) < closest_sq_distance) {
            m_parameter = domain.t1();
            m_point = point_at_t1;
            return;
        }

        m_parameter = closest_parameter;
        m_point = closest_point;
    }